

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhash_read_header(lhash_kv_engine *pEngine,unqlite_page *pHeader)

{
  int iVar1;
  undefined8 *local_48;
  unqlite_page *pPage;
  pgno iNext;
  int rc;
  sxu32 nHash;
  lhash_bmap_page *pMap;
  uchar *zRaw;
  unqlite_page *pHeader_local;
  lhash_kv_engine *pEngine_local;
  
  pMap = (lhash_bmap_page *)pHeader->zData;
  pEngine->pHeader = pHeader;
  zRaw = (uchar *)pHeader;
  pHeader_local = (unqlite_page *)pEngine;
  SyBigEndianUnpack32((uchar *)pMap,&pEngine->nMagic);
  pMap = (lhash_bmap_page *)((long)&pMap->iNum + 4);
  if (*(int *)&pHeader_local[0xd].zData == -0x587d235) {
    SyBigEndianUnpack32((uchar *)pMap,(sxu32 *)((long)&iNext + 4));
    pMap = (lhash_bmap_page *)((long)&pMap->iNum + 4);
    iVar1 = (*(code *)pHeader_local[8].zData)("chm@symisc",10);
    if (iVar1 == iNext._4_4_) {
      SyBigEndianUnpack64((uchar *)pMap,&pHeader_local[0xb].iPage);
      pMap = (lhash_bmap_page *)&pMap->iPtr;
      SyBigEndianUnpack64((uchar *)pMap,(sxu64 *)(pHeader_local + 0xc));
      pMap = (lhash_bmap_page *)&pMap->iPtr;
      SyBigEndianUnpack64((uchar *)pMap,(sxu64 *)&pHeader_local[0xc].pUserData);
      pMap = (lhash_bmap_page *)&pMap->iPtr;
      pHeader_local[0xc].iPage = (long)pHeader_local[0xc].pUserData << 1;
      _rc = (lhash_bmap_page *)&pHeader_local[10].pUserData;
      *(void **)_rc = *(void **)(zRaw + 0x10);
      SyBigEndianUnpack64((uchar *)pMap,(sxu64 *)(pHeader_local + 0xb));
      pMap = (lhash_bmap_page *)&pMap->iPtr;
      SyBigEndianUnpack32((uchar *)pMap,&_rc->nRec);
      pMap = (lhash_bmap_page *)((long)&pMap->iNum + 4);
      _rc->iPtr = (short)pMap - (short)*(undefined8 *)zRaw;
      pEngine_local._4_4_ = lhMapLoadPage((lhash_kv_engine *)pHeader_local,_rc,*(uchar **)zRaw);
      while (pEngine_local._4_4_ == 0) {
        iNext._0_4_ = 0;
        pPage = (unqlite_page *)_rc->iNext;
        if (pPage == (unqlite_page *)0x0) {
          return 0;
        }
        iNext._0_4_ = (**(code **)(pHeader_local->zData + 0x10))
                                (*(undefined8 *)pHeader_local->zData,pPage,&local_48);
        if ((int)iNext != 0) {
          return (int)iNext;
        }
        _rc->iNum = (pgno)pPage;
        _rc->iPtr = 0;
        pEngine_local._4_4_ = lhMapLoadPage((lhash_kv_engine *)pHeader_local,_rc,(uchar *)*local_48)
        ;
      }
    }
    else {
      (**(code **)(pHeader_local->zData + 0x80))
                (*(undefined8 *)pHeader_local->zData,"Invalid hash function");
      pEngine_local._4_4_ = -9;
    }
  }
  else {
    pEngine_local._4_4_ = -0x18;
  }
  return pEngine_local._4_4_;
}

Assistant:

static int lhash_read_header(lhash_kv_engine *pEngine,unqlite_page *pHeader)
{
	const unsigned char *zRaw = pHeader->zData;
	lhash_bmap_page *pMap;
	sxu32 nHash;
	int rc;
	pEngine->pHeader = pHeader;
	/* 4 byte magic number */
	SyBigEndianUnpack32(zRaw,&pEngine->nMagic);
	zRaw += 4;
	if( pEngine->nMagic != L_HASH_MAGIC ){
		/* Corrupt implementation */
		return UNQLITE_CORRUPT;
	}
	/* 4 byte hash value to identify a valid hash function */
	SyBigEndianUnpack32(zRaw,&nHash);
	zRaw += 4;
	/* Sanity check */
	if( pEngine->xHash(L_HASH_WORD,sizeof(L_HASH_WORD)-1) != nHash ){
		/* Different hash function */
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"Invalid hash function");
		return UNQLITE_INVALID;
	}
	/* List of free pages */
	SyBigEndianUnpack64(zRaw,&pEngine->nFreeList);
	zRaw += 8;
	/* Current split bucket */
	SyBigEndianUnpack64(zRaw,&pEngine->split_bucket);
	zRaw += 8;
	/* Maximum split bucket */
	SyBigEndianUnpack64(zRaw,&pEngine->max_split_bucket);
	zRaw += 8;
	/* Next generation */
	pEngine->nmax_split_nucket = pEngine->max_split_bucket << 1;
	/* Initialiaze the bucket map */
	pMap = &pEngine->sPageMap;
	/* Fill in the structure */
	pMap->iNum = pHeader->iPage;
	/* Next page in the bucket map */
	SyBigEndianUnpack64(zRaw,&pMap->iNext);
	zRaw += 8;
	/* Total number of records in the bucket map (This page only) */
	SyBigEndianUnpack32(zRaw,&pMap->nRec);
	zRaw += 4;
	pMap->iPtr = (sxu16)(zRaw - pHeader->zData);
	/* Load the map in memory */
	rc = lhMapLoadPage(pEngine,pMap,pHeader->zData);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Load the bucket map chain if any */
	for(;;){
		pgno iNext = pMap->iNext;
		unqlite_page *pPage;
		if( iNext == 0 ){
			/* No more map pages */
			break;
		}
		/* Point to the target page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iNext,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Fill in the structure */
		pMap->iNum = iNext;
		pMap->iPtr = 0;
		/* Load the map in memory */
		rc = lhMapLoadPage(pEngine,pMap,pPage->zData);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	/* All done */
	return UNQLITE_OK;
}